

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

appender __thiscall
fmt::v10::detail::write_int<fmt::v10::appender,unsigned__int128,char>
          (detail *this,appender out,unsigned___int128 value,uint prefix,format_specs<char> *specs,
          digit_grouping<char> *grouping)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 n [16];
  undefined1 value_00 [16];
  uint uVar3;
  uint uVar4;
  int iVar5;
  char *digits;
  byte *pbVar6;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> bVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  char *pcVar11;
  ulong uVar12;
  char *pcVar13;
  undefined4 in_register_00000014;
  int iVar14;
  ulong uVar15;
  char cVar16;
  undefined8 *in_R9;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  bool bVar20;
  bool bVar21;
  format_decimal_result<char_*> fVar22;
  char buffer_1 [39];
  memory_buffer buffer;
  undefined1 in_stack_fffffffffffffd08 [12];
  anon_class_24_3_e2c60416 local_2d8;
  undefined3 uStack_2c0;
  undefined4 uStack_2bd;
  undefined1 uStack_2b9;
  undefined1 uStack_2b8;
  undefined2 uStack_2b7;
  undefined4 uStack_2b5;
  undefined4 uStack_2b1;
  memory_buffer local_248;
  
  uVar12 = CONCAT44(in_register_00000014,prefix);
  uVar4 = (uint)specs;
  local_248.super_buffer<char>.ptr_ = local_248.store_;
  local_248.super_buffer<char>.size_ = 0;
  local_248.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_001f1ef8;
  local_248.super_buffer<char>.capacity_ = 500;
  cVar16 = (char)(grouping->grouping_)._M_string_length;
  switch(cVar16) {
  case '\0':
  case '\x01':
    n._12_4_ = uVar4;
    n._0_12_ = in_stack_fffffffffffffd08;
    uVar3 = count_digits_fallback<unsigned__int128>
                      ((detail *)
                       out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container,
                       (unsigned___int128)n);
    uVar18 = (ulong)uVar3;
    local_2d8.buffer = (memory_buffer *)0x0;
    uStack_2c0 = 0;
    uStack_2bd = 0;
    local_2d8.prefix = (uint *)0x0;
    local_2d8.grouping = (digit_grouping<char> *)0x0;
    uStack_2b9 = 0;
    uStack_2b8 = 0;
    uStack_2b7 = 0;
    uStack_2b5 = 0;
    value_00._12_4_ = uVar4;
    value_00._0_12_ = in_stack_fffffffffffffd08;
    fVar22 = format_decimal<char,unsigned__int128>
                       ((detail *)&local_2d8,
                        (char *)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                container,(unsigned___int128)value_00,prefix);
    copy_str_noinline<char,char*,fmt::v10::appender>
              ((char *)&local_2d8,fVar22.end,(appender)&local_248);
    break;
  case '\x02':
    pbVar6 = (byte *)((long)&local_248.super_buffer<char>.capacity_ + 7);
    lVar10 = -1;
    uVar15 = uVar12;
    bVar7 = out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
    uVar18 = 0;
    do {
      uVar19 = uVar18;
      lVar9 = lVar10;
      uVar1 = uVar15 << 0x3d;
      pbVar6 = pbVar6 + 1;
      lVar10 = lVar9 + 1;
      uVar18 = uVar19 + 1;
      bVar20 = (buffer<char> *)0x7 < bVar7.container;
      bVar21 = uVar15 != 0;
      uVar2 = -uVar15;
      uVar15 = uVar15 >> 3;
      bVar7.container = (buffer<char> *)(uVar1 | (ulong)bVar7.container >> 3);
    } while (bVar21 || uVar2 < bVar20);
    if ((((grouping->grouping_)._M_string_length & 0x8000) != 0) &&
       ((out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container !=
         (buffer<char> *)0x0 || uVar12 != 0) &&
        *(int *)((long)&(grouping->grouping_)._M_dataplus._M_p + 4) <= (int)uVar18)) {
      uVar3 = 0x3000;
      if (uVar4 == 0) {
        uVar3 = 0x30;
      }
      uVar4 = (uVar3 | uVar4) + 0x1000000;
    }
    if ((uint)lVar10 < 500) {
      do {
        uVar15 = uVar12 << 0x3d;
        *pbVar6 = SUB81(out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container,0)
                  & 7 | 0x30;
        pbVar6 = pbVar6 + -1;
        bVar20 = ((ulong)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container <
                 (buffer<char> *)0x8) <= uVar12;
        uVar12 = uVar12 >> 3;
        out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container =
             (back_insert_iterator<fmt::v10::detail::buffer<char>_>)
             (buffer<char> *)
             (uVar15 | (ulong)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                              container >> 3);
        local_248.super_buffer<char>.size_ = uVar18;
      } while (bVar20);
    }
    else {
      pbVar6 = (byte *)((long)&local_2d8.prefix + lVar9 + 1);
      uStack_2b8 = 0;
      uStack_2b7 = 0;
      uStack_2b5 = 0;
      uStack_2b1 = 0;
      local_2d8.buffer = (memory_buffer *)0x0;
      uStack_2c0 = 0;
      uStack_2bd = 0;
      uStack_2b9 = 0;
      local_2d8.prefix = (uint *)0x0;
      local_2d8.grouping = (digit_grouping<char> *)0x0;
      do {
        *pbVar6 = SUB81(out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container,0)
                  & 7 | 0x30;
        uVar15 = uVar12 << 0x3d;
        pbVar6 = pbVar6 + -1;
        bVar20 = (buffer<char> *)0x7 <
                 (ulong)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
        bVar21 = uVar12 != 0;
        uVar1 = -uVar12;
        uVar12 = uVar12 >> 3;
        out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container =
             (back_insert_iterator<fmt::v10::detail::buffer<char>_>)
             (buffer<char> *)
             (uVar15 | (ulong)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                              container >> 3);
      } while (bVar21 || uVar1 < bVar20);
      copy_str_noinline<char,char*,fmt::v10::appender>
                ((char *)&local_2d8,(char *)((long)&local_2d8.prefix + uVar19 + 1),
                 (appender)&local_248);
    }
    break;
  case '\x03':
  case '\x04':
    if (((grouping->grouping_)._M_string_length & 0x8000) != 0) {
      uVar8 = (uint)(cVar16 != '\x04') << 0xd | 0x5830;
      uVar3 = uVar8 << 8;
      if (uVar4 == 0) {
        uVar3 = uVar8;
      }
      uVar4 = (uVar3 | uVar4) + 0x2000000;
    }
    pcVar11 = (char *)((long)&local_248.super_buffer<char>.capacity_ + 7);
    lVar10 = -1;
    uVar15 = uVar12;
    bVar7 = out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
    uVar18 = 0;
    do {
      uVar19 = uVar18;
      lVar9 = lVar10;
      uVar1 = uVar15 << 0x3c;
      pcVar11 = pcVar11 + 1;
      lVar10 = lVar9 + 1;
      uVar18 = uVar19 + 1;
      bVar20 = (buffer<char> *)0xf < bVar7.container;
      bVar21 = uVar15 != 0;
      uVar2 = -uVar15;
      uVar15 = uVar15 >> 4;
      bVar7.container = (buffer<char> *)(uVar1 | (ulong)bVar7.container >> 4);
    } while (bVar21 || uVar2 < bVar20);
    if ((uint)lVar10 < 500) {
      pcVar13 = "0123456789abcdef";
      if (cVar16 == '\x04') {
        pcVar13 = "0123456789ABCDEF";
      }
      do {
        uVar15 = uVar12 << 0x3c;
        *pcVar11 = pcVar13[SUB84(out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                 container,0) & 0xf];
        pcVar11 = pcVar11 + -1;
        bVar20 = ((ulong)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container <
                 (buffer<char> *)0x10) <= uVar12;
        uVar12 = uVar12 >> 4;
        out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container =
             (back_insert_iterator<fmt::v10::detail::buffer<char>_>)
             (buffer<char> *)
             (uVar15 | (ulong)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                              container >> 4);
        local_248.super_buffer<char>.size_ = uVar18;
      } while (bVar20);
    }
    else {
      pcVar13 = (char *)((long)&local_2d8.prefix + lVar9 + 1);
      local_2d8.buffer = (memory_buffer *)0x0;
      uStack_2c0 = 0;
      uStack_2bd = 0;
      uStack_2b9 = 0;
      local_2d8.prefix = (uint *)0x0;
      local_2d8.grouping = (digit_grouping<char> *)0x0;
      uStack_2b8 = 0;
      pcVar11 = "0123456789abcdef";
      if (cVar16 == '\x04') {
        pcVar11 = "0123456789ABCDEF";
      }
      do {
        *pcVar13 = pcVar11[SUB84(out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                 container,0) & 0xf];
        uVar15 = uVar12 << 0x3c;
        pcVar13 = pcVar13 + -1;
        bVar20 = (buffer<char> *)0xf <
                 (ulong)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
        bVar21 = uVar12 != 0;
        uVar1 = -uVar12;
        uVar12 = uVar12 >> 4;
        out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container =
             (back_insert_iterator<fmt::v10::detail::buffer<char>_>)
             (buffer<char> *)
             (uVar15 | (ulong)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                              container >> 4);
      } while (bVar21 || uVar1 < bVar20);
      copy_str_noinline<char,char*,fmt::v10::appender>
                ((char *)&local_2d8,(char *)((long)&local_2d8.prefix + uVar19 + 1),
                 (appender)&local_248);
    }
    break;
  case '\x05':
  case '\x06':
    if (((grouping->grouping_)._M_string_length & 0x8000) != 0) {
      uVar8 = (uint)(cVar16 != '\x06') << 0xd | 0x4230;
      uVar3 = uVar8 << 8;
      if (uVar4 == 0) {
        uVar3 = uVar8;
      }
      uVar4 = (uVar3 | uVar4) + 0x2000000;
    }
    pbVar6 = (byte *)((long)&local_248.super_buffer<char>.capacity_ + 7);
    lVar10 = -1;
    uVar15 = uVar12;
    bVar7 = out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
    uVar18 = 0;
    do {
      uVar19 = uVar18;
      lVar9 = lVar10;
      uVar1 = uVar15 << 0x3f;
      pbVar6 = pbVar6 + 1;
      lVar10 = lVar9 + 1;
      uVar18 = uVar19 + 1;
      bVar20 = (buffer<char> *)0x1 < bVar7.container;
      bVar21 = uVar15 != 0;
      uVar2 = -uVar15;
      uVar15 = uVar15 >> 1;
      bVar7.container = (buffer<char> *)(uVar1 | (ulong)bVar7.container >> 1);
    } while (bVar21 || uVar2 < bVar20);
    if ((uint)lVar10 < 500) {
      do {
        uVar15 = uVar12 << 0x3f;
        *pbVar6 = SUB81(out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container,0)
                  & 1 | 0x30;
        pbVar6 = pbVar6 + -1;
        bVar20 = ((ulong)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container <
                 (buffer<char> *)0x2) <= uVar12;
        uVar12 = uVar12 >> 1;
        out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container =
             (back_insert_iterator<fmt::v10::detail::buffer<char>_>)
             (buffer<char> *)
             (uVar15 | (ulong)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                              container >> 1);
        local_248.super_buffer<char>.size_ = uVar18;
      } while (bVar20);
    }
    else {
      pbVar6 = (byte *)((long)&local_2d8.prefix + lVar9 + 1);
      memset(&local_2d8,0,0x81);
      do {
        *pbVar6 = SUB81(out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container,0)
                  & 1 | 0x30;
        uVar15 = uVar12 << 0x3f;
        pbVar6 = pbVar6 + -1;
        bVar20 = (buffer<char> *)0x1 <
                 (ulong)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
        bVar21 = uVar12 != 0;
        uVar1 = -uVar12;
        uVar12 = uVar12 >> 1;
        out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container =
             (back_insert_iterator<fmt::v10::detail::buffer<char>_>)
             (buffer<char> *)
             (uVar15 | (ulong)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                              container >> 1);
      } while (bVar21 || uVar1 < bVar20);
      copy_str_noinline<char,char*,fmt::v10::appender>
                ((char *)&local_2d8,(char *)((long)&local_2d8.prefix + uVar19 + 1),
                 (appender)&local_248);
    }
    break;
  default:
    throw_format_error("invalid format specifier");
  case '\x0f':
    local_2d8.prefix =
         (uint *)((ulong)CONCAT61(local_2d8.prefix._2_6_,
                                  (char)out.
                                        super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                        container) << 8);
    bVar7.container =
         (buffer<char> *)
         write_padded<(fmt::v10::align::type)1,fmt::v10::appender,char,fmt::v10::detail::write_char<char,fmt::v10::appender>(fmt::v10::appender,char,fmt::v10::format_specs<char>const&)::_lambda(fmt::v10::appender)_1_&>
                   ((appender)this,(format_specs<char> *)grouping,1,1,
                    (anon_class_2_2_bf5026b7 *)&local_2d8);
    goto LAB_0018b44d;
  }
  iVar17 = (int)uVar18;
  if (iVar17 < 0) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/oneapi-src[P]level-zero/third_party/spdlog_headers/spdlog/fmt/bundled/core.h"
                ,0x189,"negative value");
  }
  if (in_R9[5] != 0) {
    pcVar11 = (char *)*in_R9;
    pcVar13 = pcVar11 + in_R9[1];
    iVar5 = 0;
    iVar14 = 0;
    do {
      if (pcVar11 == pcVar13) {
        cVar16 = pcVar13[-1];
        pcVar11 = pcVar13;
      }
      else {
        cVar16 = *pcVar11;
        if ((byte)(cVar16 + 0x81U) < 0x82) goto LAB_0018b414;
        pcVar11 = pcVar11 + 1;
      }
      iVar14 = iVar14 + cVar16;
      if (iVar17 <= iVar14) goto LAB_0018b414;
      iVar5 = iVar5 + 1;
    } while( true );
  }
  iVar5 = 0;
LAB_0018b414:
  uVar12 = (ulong)(iVar17 + iVar5 + (uVar4 >> 0x18));
  local_2d8.prefix = (uint *)&stack0xfffffffffffffd14;
  local_2d8.buffer = &local_248;
  bVar7.container =
       (buffer<char> *)
       write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::write_int<fmt::v10::appender,unsigned__int128,char>(fmt::v10::appender,unsigned__int128,unsigned_int,fmt::v10::format_specs<char>const&,fmt::v10::detail::digit_grouping<char>const&)::_lambda(fmt::v10::appender)_1_>
                 ((appender)this,(format_specs<char> *)grouping,uVar12,uVar12,&local_2d8);
LAB_0018b44d:
  if (local_248.super_buffer<char>.ptr_ != local_248.store_) {
    operator_delete(local_248.super_buffer<char>.ptr_,local_248.super_buffer<char>.capacity_);
  }
  return (appender)(back_insert_iterator<fmt::v10::detail::buffer<char>_>)bVar7.container;
}

Assistant:

auto write_int(OutputIt out, UInt value, unsigned prefix,
               const format_specs<Char>& specs,
               const digit_grouping<Char>& grouping) -> OutputIt {
  static_assert(std::is_same<uint64_or_128_t<UInt>, UInt>::value, "");
  int num_digits = 0;
  auto buffer = memory_buffer();
  switch (specs.type) {
  case presentation_type::none:
  case presentation_type::dec: {
    num_digits = count_digits(value);
    format_decimal<char>(appender(buffer), value, num_digits);
    break;
  }
  case presentation_type::hex_lower:
  case presentation_type::hex_upper: {
    bool upper = specs.type == presentation_type::hex_upper;
    if (specs.alt)
      prefix_append(prefix, unsigned(upper ? 'X' : 'x') << 8 | '0');
    num_digits = count_digits<4>(value);
    format_uint<4, char>(appender(buffer), value, num_digits, upper);
    break;
  }
  case presentation_type::bin_lower:
  case presentation_type::bin_upper: {
    bool upper = specs.type == presentation_type::bin_upper;
    if (specs.alt)
      prefix_append(prefix, unsigned(upper ? 'B' : 'b') << 8 | '0');
    num_digits = count_digits<1>(value);
    format_uint<1, char>(appender(buffer), value, num_digits);
    break;
  }
  case presentation_type::oct: {
    num_digits = count_digits<3>(value);
    // Octal prefix '0' is counted as a digit, so only add it if precision
    // is not greater than the number of digits.
    if (specs.alt && specs.precision <= num_digits && value != 0)
      prefix_append(prefix, '0');
    format_uint<3, char>(appender(buffer), value, num_digits);
    break;
  }
  case presentation_type::chr:
    return write_char(out, static_cast<Char>(value), specs);
  default:
    throw_format_error("invalid format specifier");
  }

  unsigned size = (prefix != 0 ? prefix >> 24 : 0) + to_unsigned(num_digits) +
                  to_unsigned(grouping.count_separators(num_digits));
  return write_padded<align::right>(
      out, specs, size, size, [&](reserve_iterator<OutputIt> it) {
        for (unsigned p = prefix & 0xffffff; p != 0; p >>= 8)
          *it++ = static_cast<Char>(p & 0xff);
        return grouping.apply(it, string_view(buffer.data(), buffer.size()));
      });
}